

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall
cmdline::parser::
option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::option_with_value(option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,string *name,char short_name,bool need,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def,
                   string *desc)

{
  byte bVar1;
  byte in_CL;
  undefined1 in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  option_base *in_RDI;
  string *in_stack_000000b0;
  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_000000b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffe8;
  
  bVar1 = in_CL & 1;
  option_base::option_base(in_RDI);
  in_RDI->_vptr_option_base = (_func_int **)&PTR__option_with_value_0020cbf8;
  std::__cxx11::string::string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined1 *)&in_RDI[5]._vptr_option_base = in_DL;
  *(byte *)((long)&in_RDI[5]._vptr_option_base + 1) = bVar1 & 1;
  std::__cxx11::string::string(in_stack_ffffffffffffff90);
  *(undefined1 *)&in_RDI[10]._vptr_option_base = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xf);
  std::__cxx11::string::string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  full_description(in_stack_000000b8,in_stack_000000b0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_DL,CONCAT16(bVar1,in_stack_ffffffffffffffe8)));
  std::__cxx11::string::~string(this_00);
  return;
}

Assistant:

option_with_value(const std::string &name, char short_name, bool need,
                      const T &def, const std::string &desc)
        : nam(name),
          snam(short_name),
          need(need),
          has(false),
          def(def),
          actual(def) {
      this->desc = full_description(desc);
    }